

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getShadowSamplingFunctionCall
          (TextureCubeMapArraySamplingTest *this,samplingFunction sampling_function,
          GLchar *color_type,GLuint n_components,GLchar *attribute_name_prefix,
          GLchar *attribute_index,GLchar *color_variable_name,GLchar *color_variable_index,
          GLchar *sampler_name_p,string *out_code)

{
  NotSupportedError *this_00;
  ostream *poVar1;
  string local_330 [32];
  var2str local_310;
  var2str local_2f8;
  var2str local_2e0;
  var2str local_2c8;
  var2str local_2b0;
  var2str local_298;
  uint local_27c;
  undefined1 local_278 [4];
  GLuint i;
  var2str local_260;
  var2str local_248;
  var2str local_230;
  var2str local_218;
  var2str local_200;
  var2str local_1e8;
  stringstream local_1c0 [8];
  stringstream stream;
  ostream local_1b0;
  GLchar *local_38;
  GLchar *attribute_index_local;
  GLchar *attribute_name_prefix_local;
  GLchar *pGStack_20;
  GLuint n_components_local;
  GLchar *color_type_local;
  TextureCubeMapArraySamplingTest *pTStack_10;
  samplingFunction sampling_function_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  local_38 = attribute_index;
  attribute_index_local = attribute_name_prefix;
  attribute_name_prefix_local._4_4_ = n_components;
  pGStack_20 = color_type;
  color_type_local._4_4_ = sampling_function;
  pTStack_10 = this;
  std::__cxx11::stringstream::stringstream(local_1c0);
  switch(color_type_local._4_4_) {
  case Texture:
    poVar1 = std::operator<<(&local_1b0,"    ");
    var2str::var2str(&local_1e8,(GLchar *)0x0,color_variable_name,color_variable_index);
    glcts::operator<<(poVar1,&local_1e8);
    poVar1 = std::operator<<(&local_1b0," = ");
    poVar1 = std::operator<<(poVar1,"texture");
    poVar1 = std::operator<<(poVar1,"(");
    std::operator<<(poVar1,sampler_name_p);
    poVar1 = std::operator<<(&local_1b0,", ");
    var2str::var2str(&local_200,attribute_index_local,"texture_coordinates",local_38);
    poVar1 = glcts::operator<<(poVar1,&local_200);
    poVar1 = std::operator<<(poVar1,", ");
    var2str::var2str(&local_218,attribute_index_local,"refZ",local_38);
    glcts::operator<<(poVar1,&local_218);
    poVar1 = std::operator<<(&local_1b0,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case TextureLod:
    poVar1 = std::operator<<(&local_1b0,"    ");
    var2str::var2str(&local_230,(GLchar *)0x0,color_variable_name,color_variable_index);
    glcts::operator<<(poVar1,&local_230);
    poVar1 = std::operator<<(&local_1b0," = ");
    poVar1 = std::operator<<(poVar1,"textureLod");
    poVar1 = std::operator<<(poVar1,"(");
    std::operator<<(poVar1,sampler_name_p);
    poVar1 = std::operator<<(&local_1b0,", ");
    var2str::var2str(&local_248,attribute_index_local,"texture_coordinates",local_38);
    poVar1 = glcts::operator<<(poVar1,&local_248);
    poVar1 = std::operator<<(poVar1,", ");
    var2str::var2str(&local_260,attribute_index_local,"lod",local_38);
    poVar1 = glcts::operator<<(poVar1,&local_260);
    poVar1 = std::operator<<(poVar1,", ");
    var2str::var2str((var2str *)local_278,attribute_index_local,"refZ",local_38);
    glcts::operator<<(poVar1,(var2str *)local_278);
    poVar1 = std::operator<<(&local_1b0,");");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case TextureGrad:
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"textureGrad operation is not available for samplerCubeArrayShadow","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
               ,0xbfe);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  case TextureGather:
    if (attribute_name_prefix_local._4_4_ == 4) {
      for (local_27c = 0; local_27c < 4; local_27c = local_27c + 1) {
        poVar1 = std::operator<<(&local_1b0,"    ");
        poVar1 = std::operator<<(poVar1,pGStack_20);
        poVar1 = std::operator<<(poVar1,"component_");
        std::ostream::operator<<(poVar1,local_27c);
        poVar1 = std::operator<<(&local_1b0," = ");
        poVar1 = std::operator<<(poVar1,"textureGather");
        poVar1 = std::operator<<(poVar1,"(");
        std::operator<<(poVar1,sampler_name_p);
        poVar1 = std::operator<<(&local_1b0,", ");
        var2str::var2str(&local_298,attribute_index_local,"texture_coordinates",local_38);
        poVar1 = glcts::operator<<(poVar1,&local_298);
        poVar1 = std::operator<<(poVar1,", ");
        var2str::var2str(&local_2b0,attribute_index_local,"refZ",local_38);
        glcts::operator<<(poVar1,&local_2b0);
        poVar1 = std::operator<<(&local_1b0,");");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
      poVar1 = std::operator<<(&local_1b0,"    ");
      var2str::var2str(&local_2c8,(GLchar *)0x0,color_variable_name,color_variable_index);
      glcts::operator<<(poVar1,&local_2c8);
      poVar1 = std::operator<<(&local_1b0," = ");
      poVar1 = std::operator<<(poVar1,pGStack_20);
      poVar1 = std::operator<<(poVar1,"(component_0.r, ");
      poVar1 = std::operator<<(poVar1,"component_1.g, ");
      poVar1 = std::operator<<(poVar1,"component_2.b, ");
      poVar1 = std::operator<<(poVar1,"component_3.a);");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar1 = std::operator<<(&local_1b0,"    ");
      var2str::var2str(&local_2e0,(GLchar *)0x0,color_variable_name,color_variable_index);
      glcts::operator<<(poVar1,&local_2e0);
      poVar1 = std::operator<<(&local_1b0," = ");
      poVar1 = std::operator<<(poVar1,"textureGather");
      poVar1 = std::operator<<(poVar1,"(");
      std::operator<<(poVar1,sampler_name_p);
      poVar1 = std::operator<<(&local_1b0,", ");
      var2str::var2str(&local_2f8,attribute_index_local,"texture_coordinates",local_38);
      poVar1 = glcts::operator<<(poVar1,&local_2f8);
      poVar1 = std::operator<<(poVar1,", ");
      var2str::var2str(&local_310,attribute_index_local,"refZ",local_38);
      glcts::operator<<(poVar1,&local_310);
      poVar1 = std::operator<<(&local_1b0,").x;");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)out_code,local_330);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getShadowSamplingFunctionCall(
	samplingFunction sampling_function, const glw::GLchar* color_type, glw::GLuint n_components,
	const glw::GLchar* attribute_name_prefix, const glw::GLchar* attribute_index,
	const glw::GLchar* color_variable_name, const glw::GLchar* color_variable_index, const glw::GLchar* sampler_name_p,
	std::string& out_code)
{
	std::stringstream stream;

	switch (sampling_function)
	{
	case Texture:
		/* fs_in_color = texture(sampler, vs_out_texture_coordinates); */
		stream << "    " << var2str(0, color_variable_name, color_variable_index);

		stream << " = " << texture_func << "(" << sampler_name_p;

		stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
			   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

		stream << ");" << std::endl;
		break;
	case TextureLod:
		/* fs_in_color = textureLod(sampler, vs_out_texture_coordinates, lod); */
		stream << "    " << var2str(0, color_variable_name, color_variable_index);

		stream << " = " << textureLod_func << "(" << sampler_name_p;

		stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
			   << var2str(attribute_name_prefix, attribute_lod, attribute_index) << ", "
			   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

		stream << ");" << std::endl;
		break;
	case TextureGrad:
		/* fs_in_color = textureGrad(sampler, vs_out_texture_coordinates, vs_out_grad_x, vs_out_grad_y); */
		throw tcu::NotSupportedError("textureGrad operation is not available for samplerCubeArrayShadow", "", __FILE__,
									 __LINE__);
		break;
	case TextureGather:
		if (4 == n_components)
		{
			/**
			 *  color_type component_0 = textureGather(sampler, vs_out_texture_coordinates, 0);
			 *  color_type component_1 = textureGather(sampler, vs_out_texture_coordinates, 1);
			 *  color_type component_2 = textureGather(sampler, vs_out_texture_coordinates, 2);
			 *  color_type component_3 = textureGather(sampler, vs_out_texture_coordinates, 3);
			 *  fs_in_color = color_type(component_0.r, component_1.g, component_2.b, component_3.a);
			 **/
			for (glw::GLuint i = 0; i < 4; ++i)
			{
				stream << "    " << color_type << "component_" << i;

				stream << " = " << textureGather_func << "(" << sampler_name_p;

				stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
					   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

				stream << ");" << std::endl;
			}

			stream << "    " << var2str(0, color_variable_name, color_variable_index);

			stream << " = " << color_type << "(component_0.r, "
				   << "component_1.g, "
				   << "component_2.b, "
				   << "component_3.a);" << std::endl;
		}
		else
		{
			stream << "    " << var2str(0, color_variable_name, color_variable_index);

			stream << " = " << textureGather_func << "(" << sampler_name_p;

			stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
				   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

			stream << ").x;" << std::endl;
		}
		break;
	}

	out_code = stream.str();
}